

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int k;
  int iVar6;
  long lVar7;
  double *pdVar8;
  int iVar9;
  
  uVar1 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  iVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
  iVar6 = startPattern * 4;
  for (uVar5 = 0; uVar5 != (~((int)uVar1 >> 0x1f) & uVar1); uVar5 = uVar5 + 1) {
    iVar9 = uVar5 * 0x14;
    pdVar8 = destP + (long)iVar6 + 3;
    for (lVar7 = (long)startPattern; lVar7 < endPattern; lVar7 = lVar7 + 1) {
      iVar3 = states1[lVar7];
      iVar4 = states2[lVar7];
      pdVar8[-3] = matrices1[iVar3 + iVar9] * matrices2[iVar4 + iVar9];
      pdVar8[-2] = matrices1[iVar3 + iVar9 + 5] * matrices2[iVar4 + iVar9 + 5];
      pdVar8[-1] = matrices1[iVar3 + iVar9 + 10] * matrices2[iVar4 + iVar9 + 10];
      *pdVar8 = matrices1[iVar3 + iVar9 + 0xf] * matrices2[iVar4 + iVar9 + 0xf];
      pdVar8 = pdVar8 + 4;
    }
    iVar6 = iVar6 + iVar2 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                               const int* states1,
                                                               const REALTYPE* matrices1,
                                                               const int* states2,
                                                               const REALTYPE* matrices2,
                                                               int startPattern,
                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          v += 4*startPattern;
        }

        int w = l*4*OFFSET;

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const int state2 = states2[k];

            destP[v    ] = matrices1[w            + state1] *
                           matrices2[w            + state2];
            destP[v + 1] = matrices1[w + OFFSET*1 + state1] *
                           matrices2[w + OFFSET*1 + state2];
            destP[v + 2] = matrices1[w + OFFSET*2 + state1] *
                           matrices2[w + OFFSET*2 + state2];
            destP[v + 3] = matrices1[w + OFFSET*3 + state1] *
                           matrices2[w + OFFSET*3 + state2];
           v += 4;
        }
    }
}